

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,Options *dbOptions,ReadOptions *options,
                  BlockHandle *handle,BlockContents *result)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  long *plVar4;
  DecompressAllocator *pDVar5;
  size_t __n;
  ReadOptions *pRVar6;
  char cVar7;
  uint32_t uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  Code code;
  string buffer;
  Slice contents;
  char *local_a8;
  Slice local_a0;
  char local_90;
  undefined7 uStack_8f;
  ReadOptions *local_80;
  Options *local_78;
  Slice local_70;
  long local_60 [2];
  char *local_50;
  ulong local_48;
  Slice local_40;
  
  (result->data).data_ = "";
  (result->data).size_ = 0;
  result->cachable = false;
  result->heap_allocated = false;
  uVar3 = handle->size_;
  uVar1 = uVar3 + 5;
  local_80 = options;
  local_78 = dbOptions;
  pcVar9 = (char *)operator_new__(uVar1);
  local_50 = "";
  local_48 = 0;
  (*file->_vptr_RandomAccessFile[2])(&local_a8,file,handle->offset_,uVar1,&local_50,pcVar9);
  pcVar10 = local_50;
  pRVar6 = local_80;
  if (local_a8 == (char *)0x0) {
    if (local_48 == uVar1) {
      if ((local_80->verify_checksums == true) &&
         (iVar2 = *(int *)(local_50 + uVar3 + 1), uVar8 = crc32c::Extend(0,local_50,uVar3 + 1),
         uVar8 != ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
        operator_delete__(pcVar9);
        local_a0.data_ = "block checksum mismatch";
        local_a0.size_ = 0x17;
        local_70.data_ = "";
        local_70.size_ = 0;
        Status::Status((Status *)&local_40,kCorruption,&local_a0,&local_70);
        pcVar9 = local_40.data_;
        pcVar10 = local_a8;
        local_a8 = local_40.data_;
        local_40.data_ = pcVar10;
        if (pcVar10 != (char *)0x0) {
          operator_delete__(pcVar10);
        }
        goto LAB_0010e38c;
      }
      if (pcVar10[uVar3] != 0) {
        lVar11 = 0;
        do {
          plVar4 = *(long **)((long)local_78->compressors + lVar11);
          if (plVar4 == (long *)0x0) break;
          if ((int)(char)plVar4[3] == (uint)(byte)pcVar10[uVar3]) {
            local_a0.data_ = &local_90;
            local_a0.size_ = 0;
            local_90 = '\0';
            if (pRVar6->decompress_allocator != (DecompressAllocator *)0x0) {
              (*pRVar6->decompress_allocator->_vptr_DecompressAllocator[2])(&local_70);
              std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_70);
              if ((long *)local_70.data_ != local_60) {
                operator_delete(local_70.data_,local_60[0] + 1);
              }
            }
            cVar7 = (**(code **)(*plVar4 + 0x18))(plVar4,pcVar10,uVar3,&local_a0);
            __n = local_a0.size_;
            if (cVar7 != '\0') {
              pcVar10 = (char *)operator_new__(local_a0.size_);
              memcpy(pcVar10,local_a0.data_,__n);
              (result->data).data_ = pcVar10;
              (result->data).size_ = __n;
              result->cachable = true;
              result->heap_allocated = true;
            }
            operator_delete__(pcVar9);
            pDVar5 = local_80->decompress_allocator;
            if (pDVar5 != (DecompressAllocator *)0x0) {
              (*pDVar5->_vptr_DecompressAllocator[3])(pDVar5,&local_a0);
            }
            if (cVar7 == '\0') {
              local_70.data_ = "corrupted compressed block contents";
              local_70.size_ = 0x23;
              local_40.data_ = "";
              local_40.size_ = 0;
              Status::Status((Status *)this,kCorruption,&local_70,&local_40);
              if (local_a0.data_ != &local_90) {
                operator_delete(local_a0.data_,CONCAT71(uStack_8f,local_90) + 1);
              }
              goto LAB_0010e649;
            }
            if (local_a0.data_ != &local_90) {
              operator_delete(local_a0.data_,CONCAT71(uStack_8f,local_90) + 1);
            }
            goto LAB_0010e641;
          }
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x800);
        operator_delete__(pcVar9);
        local_a0.data_ = "encountered a block compressed with an unknown decompressor";
        local_a0.size_ = 0x3b;
        code = kNotSupported;
        goto LAB_0010e4a2;
      }
      if (pcVar10 == pcVar9) {
        (result->data).data_ = pcVar9;
        (result->data).size_ = uVar3;
        result->cachable = true;
        result->heap_allocated = true;
      }
      else {
        operator_delete__(pcVar9);
        (result->data).data_ = pcVar10;
        (result->data).size_ = uVar3;
        result->cachable = false;
        result->heap_allocated = false;
      }
LAB_0010e641:
      *(undefined8 *)this = 0;
    }
    else {
      operator_delete__(pcVar9);
      local_a0.data_ = "truncated block read";
      local_a0.size_ = 0x14;
      code = kCorruption;
LAB_0010e4a2:
      local_70.size_ = 0;
      local_70.data_ = "";
      Status::Status((Status *)this,code,&local_a0,&local_70);
    }
LAB_0010e649:
    if (local_a8 != (char *)0x0) {
      operator_delete__(local_a8);
    }
  }
  else {
    operator_delete__(pcVar9);
LAB_0010e38c:
    *(char **)this = local_a8;
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const Options& dbOptions, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

		unsigned char compressionID = data[n];

		if (compressionID == 0) {
			if (data != buf) {
				// File implementation gave us pointer to some other data.
				// Use it directly under the assumption that it will be live
				// while the file is open.
				delete[] buf;
				result->data = Slice(data, n);
				result->heap_allocated = false;
				result->cachable = false;  // Do not double-cache
			}
			else {
				result->data = Slice(buf, n);
				result->heap_allocated = true;
				result->cachable = true;
			}
		}
		else {

			//find the required compressor
			Compressor* compressor = nullptr;
			for (auto& c : dbOptions.compressors) {
				if (!c || c->uniqueCompressionID == compressionID) {
					compressor = c;
					break;
				}
			}

			if (compressor == nullptr) {
				delete[] buf;
				return Status::NotSupported("encountered a block compressed with an unknown decompressor");
			}

			std::string buffer;
			if (options.decompress_allocator) {
				buffer = options.decompress_allocator->get();
			}

			bool success = compressor->decompress(data, n, buffer);

			if (success) {
				auto ubuf = new char[buffer.size()];
				memcpy(ubuf, buffer.data(), buffer.size());
				result->data = Slice(ubuf, buffer.size());
				result->heap_allocated = true;
				result->cachable = true;
			}

			delete[] buf;
			
			if (options.decompress_allocator) {
				options.decompress_allocator->release(std::move(buffer));
			}

			if (!success) {
				return Status::Corruption("corrupted compressed block contents");
			}
		}

		return Status::OK();
	}